

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O3

int sat_solver3_solve_lexsat(sat_solver3 *s,int *pLits,int nLits)

{
  char cVar1;
  int i;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int local_38;
  
  if (nLits < 1) {
    __assert_fail("nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                  ,0x819,"int sat_solver3_solve_lexsat(sat_solver3 *, int *, int)");
  }
  uVar4 = 0;
  do {
    uVar3 = pLits[uVar4];
    if ((int)uVar3 < 0) goto LAB_0090330e;
    s->polarity[uVar3 >> 1] = ~(byte)uVar3 & 1;
    uVar4 = uVar4 + 1;
  } while ((uint)nLits != uVar4);
  iVar2 = sat_solver3_solve_internal(s);
  if (iVar2 != 1) {
    return iVar2;
  }
  uVar4 = 0;
  while( true ) {
    uVar3 = pLits[uVar4];
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (s->size <= (int)(uVar3 >> 1)) {
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.h"
                    ,0xd5,"int sat_solver3_var_literal(sat_solver3 *, int)");
    }
    if (uVar3 != ((uint)(s->model[uVar3 >> 1] != 1) | uVar3 & 0x7ffffffe)) break;
    uVar4 = uVar4 + 1;
    if ((uint)nLits == uVar4) {
      return 1;
    }
  }
  if (nLits == (uint)uVar4) {
    return 1;
  }
  uVar7 = ~uVar4;
  lVar6 = uVar4 + 1;
  uVar5 = 0xffffffffffffffff;
  do {
    iVar2 = sat_solver3_push(s,pLits[uVar5 + 1]);
    local_38 = (int)lVar6;
    if (iVar2 == 0) goto LAB_00903258;
    uVar5 = uVar5 + 1;
  } while (uVar4 != uVar5);
  uVar3 = sat_solver3_solve_internal(s);
  cVar1 = (char)uVar3;
  if (cVar1 == -1) {
LAB_00903258:
    if (pLits[uVar4] < 0) {
LAB_0090330e:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((pLits[uVar4] & 1U) == 0) {
      __assert_fail("Abc_LitIsCompl(pLits[iLitFail])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x83c,"int sat_solver3_solve_lexsat(sat_solver3 *, int *, int)");
    }
    sat_solver3_pop(s);
    if (pLits[uVar4] < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    uVar3 = pLits[uVar4] ^ 1;
    pLits[uVar4] = uVar3;
    iVar2 = sat_solver3_push(s,uVar3);
    if (iVar2 == 0) {
      puts("sat_solver3_solve_lexsat(): A satisfying assignment should exist.");
    }
    cVar1 = '\x01';
    if (nLits <= local_38) goto LAB_009032ee;
    do {
      if (pLits[lVar6] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x133,"int Abc_LitRegular(int)");
      }
      pLits[lVar6] = pLits[lVar6] | 1;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 < nLits);
  }
  else if ((uVar3 & 0xff) != 1) goto LAB_009032ee;
  cVar1 = '\x01';
  if (local_38 < nLits) {
    iVar2 = sat_solver3_solve_lexsat(s,pLits + uVar4 + 1,~(uint)uVar4 + nLits);
    cVar1 = (char)iVar2;
  }
LAB_009032ee:
  do {
    sat_solver3_pop(s);
    uVar3 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar3;
  } while (uVar3 != 0);
  return (int)cVar1;
}

Assistant:

int sat_solver3_solve_lexsat( sat_solver3* s, int * pLits, int nLits )
{
    int i, iLitFail = -1;
    lbool status;
    assert( nLits > 0 );
    // help the SAT solver by setting desirable polarity
    sat_solver3_set_literal_polarity( s, pLits, nLits );
    // check if there exists a satisfying assignment
    status = sat_solver3_solve_internal( s );
    if ( status != l_True ) // no assignment
        return status;
    // there is at least one satisfying assignment
    assert( status == l_True );
    // find the first mismatching literal
    for ( i = 0; i < nLits; i++ )
        if ( pLits[i] != sat_solver3_var_literal(s, Abc_Lit2Var(pLits[i])) )
            break;
    if ( i == nLits ) // no mismatch - the current assignment is the minimum one!
        return l_True;
    // mismatch happens in literal i
    iLitFail = i;
    // create assumptions up to this literal (as in pLits) - including this literal!
    for ( i = 0; i <= iLitFail; i++ )
        if ( !sat_solver3_push(s, pLits[i]) ) // can become UNSAT while adding the last assumption
            break;
    if ( i < iLitFail + 1 ) // the solver became UNSAT while adding assumptions
        status = l_False;
    else // solve under the assumptions
        status = sat_solver3_solve_internal( s );
    if ( status == l_True )
    {
        // we proved that there is a sat assignment with literal (iLitFail) having polarity as in pLits
        // continue solving recursively
        if ( iLitFail + 1 < nLits )
            status = sat_solver3_solve_lexsat( s, pLits + iLitFail + 1, nLits - iLitFail - 1 );
    }
    else if ( status == l_False )
    {
        // we proved that there is no assignment with iLitFail having polarity as in pLits
        assert( Abc_LitIsCompl(pLits[iLitFail]) ); // literal is 0 
        // (this assert may fail only if there is a sat assignment smaller than one originally given in pLits)
        // now we flip this literal (make it 1), change the last assumption
        // and contiue looking for the 000...0-assignment of other literals
        sat_solver3_pop( s );
        pLits[iLitFail] = Abc_LitNot(pLits[iLitFail]);
        if ( !sat_solver3_push(s, pLits[iLitFail]) )
            printf( "sat_solver3_solve_lexsat(): A satisfying assignment should exist.\n" ); // because we know that the problem is satisfiable
        // update other literals to be 000...0
        for ( i = iLitFail + 1; i < nLits; i++ )
            pLits[i] = Abc_LitNot( Abc_LitRegular(pLits[i]) );
        // continue solving recursively
        if ( iLitFail + 1 < nLits )
            status = sat_solver3_solve_lexsat( s, pLits + iLitFail + 1, nLits - iLitFail - 1 );
        else
            status = l_True;
    }
    // undo the assumptions
    for ( i = iLitFail; i >= 0; i-- )
        sat_solver3_pop( s );
    return status;
}